

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_authenticate(Curl_easy *data,char *mech,bufref *initresp)

{
  CURLcode CVar1;
  uchar *puVar2;
  
  puVar2 = Curl_bufref_ptr(initresp);
  if (puVar2 != (uchar *)0x0) {
    CVar1 = imap_sendf(data,"AUTHENTICATE %s %s",mech,puVar2);
    return CVar1;
  }
  CVar1 = imap_sendf(data,"AUTHENTICATE %s",mech);
  return CVar1;
}

Assistant:

static CURLcode imap_perform_authenticate(struct Curl_easy *data,
                                          const char *mech,
                                          const struct bufref *initresp)
{
  CURLcode result = CURLE_OK;
  const char *ir = (const char *) Curl_bufref_ptr(initresp);

  if(ir) {
    /* Send the AUTHENTICATE command with the initial response */
    result = imap_sendf(data, "AUTHENTICATE %s %s", mech, ir);
  }
  else {
    /* Send the AUTHENTICATE command */
    result = imap_sendf(data, "AUTHENTICATE %s", mech);
  }

  return result;
}